

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::EnforceStringStyle::visit(EnforceStringStyle *this,LiteralString *lit)

{
  undefined4 uVar1;
  long lVar2;
  UString *__range2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  UString canonical;
  UString local_68;
  UString local_48;
  
  if (lit->tokenKind - BLOCK < 3) {
    return;
  }
  if (lit->tokenKind == RAW_DESUGARED) {
    __assert_fail("lit->tokenKind != LiteralString::RAW_DESUGARED",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                  ,0x292,
                  "virtual void jsonnet::internal::EnforceStringStyle::visit(LiteralString *)");
  }
  jsonnet_string_unescape(&local_68,&(lit->super_AST).location,&lit->value);
  if (local_68._M_string_length == 0) {
    bVar4 = 0;
    bVar3 = 0;
  }
  else {
    iVar5 = 0;
    iVar6 = 0;
    lVar2 = 0;
    do {
      iVar5 = iVar5 + (uint)(*(int *)((long)local_68._M_dataplus._M_p + lVar2) == 0x22);
      iVar6 = iVar6 + (uint)(*(int *)((long)local_68._M_dataplus._M_p + lVar2) == 0x27);
      lVar2 = lVar2 + 4;
    } while (local_68._M_string_length << 2 != lVar2);
    auVar7._0_4_ = -(uint)(iVar5 == 0);
    auVar7._4_4_ = -(uint)(iVar5 == 0);
    auVar7._8_4_ = -(uint)(iVar6 == 0);
    auVar7._12_4_ = -(uint)(iVar6 == 0);
    uVar1 = movmskpd((int)(local_68._M_string_length << 2),auVar7);
    bVar3 = (byte)uVar1 ^ 3;
    bVar4 = bVar3 >> 1;
    if ((bVar4 & bVar3) != 0) goto LAB_001fc3ec;
  }
  bVar4 = ~bVar4 & (this->super_FmtPass).opts.stringStyle == 's';
  jsonnet_string_escape(&local_48,&local_68,(bool)(bVar4 | bVar3 & 1));
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  operator=(&lit->value,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
  }
  lit->tokenKind = (byte)~(bVar4 | bVar3) & DOUBLE;
LAB_001fc3ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void visit(LiteralString *lit)
    {
        assert(lit->tokenKind != LiteralString::RAW_DESUGARED);
        if (lit->tokenKind == LiteralString::BLOCK)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_DOUBLE)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_SINGLE)
            return;
        UString canonical = jsonnet_string_unescape(lit->location, lit->value);
        unsigned num_single = 0, num_double = 0;
        for (char32_t c : canonical) {
            if (c == '\'')
                num_single++;
            if (c == '"')
                num_double++;
        }
        if (num_single > 0 && num_double > 0)
            return;  // Don't change it.
        bool use_single = opts.stringStyle == 's';
        if (num_single > 0)
            use_single = false;
        if (num_double > 0)
            use_single = true;

        // Change it.
        lit->value = jsonnet_string_escape(canonical, use_single);
        lit->tokenKind = use_single ? LiteralString::SINGLE : LiteralString::DOUBLE;
    }